

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

int luaO_str2d(char *s,size_t len,lua_Number *result)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  double dVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int e;
  byte *local_50;
  int local_44;
  byte *local_40;
  int local_38;
  undefined4 local_34;
  
  pcVar3 = strpbrk(s,"nN");
  uVar7 = 0;
  if (pcVar3 != (char *)0x0) {
    return 0;
  }
  pcVar3 = strpbrk(s,"xX");
  if (pcVar3 == (char *)0x0) {
    dVar10 = strtod(s,(char **)&local_40);
  }
  else {
    local_44 = 0;
    local_38 = 0;
    pbVar5 = (byte *)s;
    do {
      pbVar4 = pbVar5;
      bVar1 = *pbVar4;
      pbVar5 = pbVar4 + 1;
    } while ((""[(ulong)bVar1 + 1] & 8) != 0);
    local_34 = (undefined4)CONCAT71((int7)((ulong)pbVar4 >> 8),1);
    local_50 = pbVar5;
    if ((bVar1 != 0x2b) && (local_50 = pbVar4, bVar1 == 0x2d)) {
      local_34 = 0;
      local_50 = pbVar5;
    }
    uVar11 = 0;
    uVar12 = 0;
    local_40 = (byte *)s;
    if ((*local_50 != 0x30) || ((local_50[1] | 0x20) != 0x78)) goto LAB_0010c549;
    local_50 = local_50 + 2;
    dVar10 = readhexa((char **)&local_50,0.0,&local_38);
    if (*local_50 == 0x2e) {
      local_50 = local_50 + 1;
      dVar10 = readhexa((char **)&local_50,dVar10,&local_44);
    }
    uVar11 = 0;
    uVar12 = 0;
    if (local_38 == 0 && local_44 == 0) goto LAB_0010c549;
    local_44 = local_44 * -4;
    local_40 = local_50;
    if ((*local_50 | 0x20) == 0x70) {
      bVar2 = true;
      if (local_50[1] == 0x2b) {
        pbVar5 = local_50 + 2;
      }
      else {
        pbVar5 = local_50 + 1;
        if (local_50[1] == 0x2d) {
          bVar2 = false;
          pbVar5 = local_50 + 2;
        }
      }
      local_50 = pbVar5;
      uVar8 = (ulong)*local_50;
      if ((""[uVar8 + 1] & 2) != 0) {
        iVar9 = 0;
        do {
          iVar9 = (int)(char)uVar8 + iVar9 * 10 + -0x30;
          uVar8 = (ulong)local_50[1];
          local_50 = local_50 + 1;
        } while ((""[uVar8 + 1] & 2) != 0);
        iVar6 = -iVar9;
        if (bVar2) {
          iVar6 = iVar9;
        }
        local_44 = iVar6 + local_44;
        goto LAB_0010c527;
      }
    }
    else {
LAB_0010c527:
      local_40 = local_50;
    }
    if ((char)local_34 == '\0') {
      dVar10 = -dVar10;
    }
    dVar10 = ldexp(dVar10,local_44);
  }
  uVar11 = SUB84(dVar10,0);
  uVar12 = (undefined4)((ulong)dVar10 >> 0x20);
LAB_0010c549:
  *result = (lua_Number)CONCAT44(uVar12,uVar11);
  if (local_40 != (byte *)s) {
    local_40 = local_40 + -1;
    do {
      pbVar5 = local_40 + 1;
      local_40 = local_40 + 1;
    } while ((""[(ulong)*pbVar5 + 1] & 8) != 0);
    uVar7 = (uint)(local_40 == (byte *)(s + len));
  }
  return uVar7;
}

Assistant:

int luaO_str2d (const char *s, size_t len, lua_Number *result) {
  char *endptr;
  if (strpbrk(s, "nN"))  /* reject 'inf' and 'nan' */
    return 0;
  else if (strpbrk(s, "xX"))  /* hexa? */
    *result = lua_strx2number(s, &endptr);
  else
    *result = lua_str2number(s, &endptr);
  if (endptr == s) return 0;  /* nothing recognized */
  while (lisspace(cast_uchar(*endptr))) endptr++;
  return (endptr == s + len);  /* OK if no trailing characters */
}